

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  sqlite3 *db;
  u64 uVar2;
  sqlite3_xauth p_Var3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uchar *zDb;
  uchar *zSql;
  i64 iVar8;
  uchar *zWhen;
  i64 iVar9;
  uint uVar10;
  long in_FS_OFFSET;
  NameContext local_218;
  Parse sParse;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db = context->pOut->db;
  zDb = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[1]);
  iVar8 = sqlite3VdbeIntValue(argv[4]);
  uVar2 = db->flags;
  zWhen = sqlite3_value_text(argv[5]);
  iVar9 = sqlite3VdbeIntValue(argv[6]);
  p_Var3 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  if (zSql == (uchar *)0x0 || zDb == (uchar *)0x0) goto LAB_0019d763;
  memset(&sParse,0xaa,0x1a8);
  uVar4 = db->flags;
  if ((int)iVar9 != 0) {
    db->flags = uVar4 & 0xffffffff9fffffff;
  }
  iVar6 = renameParseSql(&sParse,(char *)zDb,db,(char *)zSql,(int)iVar8);
  db->flags = db->flags | (ulong)((uint)uVar4 & 0x60000000);
  bVar5 = true;
  if (iVar6 == 0) {
    uVar10 = (uint)uVar2;
    if ((sParse.pNewTable != (Table *)0x0 && (uVar10 >> 0x1a & 1) == 0) &&
       ((sParse.pNewTable)->eTabType == '\x02')) {
      local_218.ncFlags = 0;
      local_218.nNestedSelect = 0;
      local_218.pWinSelect = (Select *)0x0;
      local_218.pNext = (NameContext *)0x0;
      local_218.nRef = 0;
      local_218.nNcErr = 0;
      local_218.pSrcList = (SrcList *)0x0;
      local_218.uNC.pEList = (ExprList *)0x0;
      local_218.pParse = &sParse;
      sqlite3SelectPrep(&sParse,((sParse.pNewTable)->u).view.pSelect,&local_218);
      bVar5 = sParse.rc != 0 && sParse.nErr != 0;
      goto LAB_0019d64c;
    }
    if (sParse.pNewTrigger != (Trigger *)0x0) {
      if (((uVar10 >> 0x1a & 1) == 0) && (iVar6 = renameResolveTrigger(&sParse), iVar6 != 0))
      goto LAB_0019d64c;
      iVar6 = sqlite3SchemaToIndex(db,(sParse.pNewTrigger)->pTabSchema);
      iVar7 = sqlite3FindDbName(db,(char *)zDb);
      if (iVar6 == iVar7) {
        sqlite3_result_int(context,1);
      }
    }
  }
  else {
LAB_0019d64c:
    if (((bool)(zWhen != (uchar *)0x0 & bVar5)) && ((db->flags & 0x10000001) != 1)) {
      renameColumnParseError(context,(char *)zWhen,argv[2],argv[3],&sParse);
    }
  }
  renameParseCleanup(&sParse);
LAB_0019d763:
  db->xAuth = p_Var3;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);
  char const *zWhen = (const char*)sqlite3_value_text(argv[5]);
  int bNoDQS = sqlite3_value_int(argv[6]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);

  if( zDb && zInput ){
    int rc;
    Parse sParse;
    int flags = db->flags;
    if( bNoDQS ) db->flags &= ~(SQLITE_DqsDML|SQLITE_DqsDDL);
    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);
    db->flags |= (flags & (SQLITE_DqsDML|SQLITE_DqsDDL));
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && IsView(sParse.pNewTable) ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->u.view.pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ){
            /* Handle output case B */
            sqlite3_result_int(context, 1);
          }
        }
      }
    }

    if( rc!=SQLITE_OK && zWhen && !sqlite3WritableSchema(db) ){
      /* Output case A */
      renameColumnParseError(context, zWhen, argv[2], argv[3],&sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}